

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CProgram *stm)

{
  bool bVar1;
  pointer pCVar2;
  element_type *peVar3;
  pointer pCVar4;
  element_type *this_00;
  shared_ptr<ClassInfo> local_38;
  shared_ptr<ClassInfo> local_28;
  CProgram *local_18;
  CProgram *stm_local;
  CConstructSymbolTableVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CProgram *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->classList);
  if (bVar1) {
    pCVar2 = std::unique_ptr<CClassList,_std::default_delete<CClassList>_>::operator->
                       (&local_18->classList);
    (**(pCVar2->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar2,this);
  }
  std::shared_ptr<ClassInfo>::shared_ptr(&local_28,(nullptr_t)0x0);
  peVar3 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<ClassInfo>::operator=(&peVar3->iClass,&local_28);
  std::shared_ptr<ClassInfo>::~shared_ptr(&local_28);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->mainClass);
  if (bVar1) {
    pCVar4 = std::unique_ptr<CMainClass,_std::default_delete<CMainClass>_>::operator->
                       (&local_18->mainClass);
    (**(pCVar4->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
  }
  this_00 = std::__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<SymbolTable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&this->table);
  peVar3 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<ClassInfo>::shared_ptr(&local_38,&peVar3->iClass);
  SymbolTable::AddClass(this_00,&local_38);
  std::shared_ptr<ClassInfo>::~shared_ptr(&local_38);
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CProgram &stm )
{
//	std::cout << "program\n";
	if( stm.classList ) {
		stm.classList->Accept( *this );
	}

	info->iClass = nullptr;
	if( stm.mainClass ) {
		stm.mainClass->Accept( *this );
	}
	table->AddClass( info->iClass );
}